

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O0

void slang::ast::UninstantiatedDefSymbol::fromSyntax
               (Compilation *compilation,HierarchyInstantiationSyntax *syntax,
               HierarchicalInstanceSyntax *specificInstance,ASTContext *parentContext,
               SmallVectorBase<const_slang::ast::Symbol_*> *results,
               SmallVectorBase<const_slang::ast::Symbol_*> *implicitNets,
               SmallSet<std::basic_string_view<char,_std::char_traits<char>_>,_8UL,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
               *implicitNetNames,NetType *netType)

{
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> params_00;
  bool bVar1;
  pointer ppEVar2;
  HierarchyInstantiationSyntax *syntax_00;
  ASTContext *in_RCX;
  HierarchyInstantiationSyntax *in_RDX;
  long in_RSI;
  Token *in_R9;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> sVar3;
  string_view sVar4;
  const_iterator cVar5;
  string_view sVar6;
  HierarchicalInstanceSyntax *instanceSyntax;
  const_iterator __end3;
  const_iterator __begin3;
  SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax> *__range3;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> params;
  ASTContext context;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffffe88;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffffe90;
  ASTContext *in_stack_fffffffffffffe98;
  bitmask<slang::ast::ASTFlags> in_stack_fffffffffffffea0;
  undefined1 in_stack_ffffffffffffff08 [16];
  HierarchyInstantiationSyntax *in_stack_ffffffffffffff18;
  Compilation *in_stack_ffffffffffffff20;
  Compilation *compilation_00;
  size_t in_stack_ffffffffffffff28;
  size_t sVar7;
  char *in_stack_ffffffffffffff30;
  ParentList *pPVar8;
  pointer in_stack_ffffffffffffff40;
  __extent_storage<18446744073709551615UL> in_stack_ffffffffffffff48;
  SmallVectorBase<const_slang::ast::Symbol_*> *in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff58 [16];
  __extent_storage<18446744073709551615UL> netType_00;
  __extent_storage<18446744073709551615UL> local_90;
  bitmask<slang::ast::ASTFlags> local_88 [8];
  Token *local_48;
  
  local_48 = in_R9;
  bitmask<slang::ast::ASTFlags>::bitmask(local_88,NonProcedural);
  ASTContext::resetFlags(in_stack_fffffffffffffe98,in_stack_fffffffffffffea0);
  sVar3 = createUninstantiatedParams(in_RDX,in_RCX);
  netType_00._M_extent_value = (size_t)sVar3._M_ptr;
  local_90 = sVar3._M_extent._M_extent_value;
  if (in_RDX == (HierarchyInstantiationSyntax *)0x0) {
    ppEVar2 = (pointer)(in_RSI + 0x68);
    cVar5 = slang::syntax::SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax>::begin
                      ((SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax> *)0xfc5b35);
    pPVar8 = cVar5.list;
    cVar5 = slang::syntax::SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax>::end
                      ((SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax> *)0xfc5b52);
    compilation_00 = (Compilation *)cVar5.list;
    sVar7 = cVar5.index;
    while (bVar1 = operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax>::iterator_base<const_slang::syntax::HierarchicalInstanceSyntax_*>_>
                             ((self_type *)in_stack_fffffffffffffe90._M_extent_value,
                              (iterator_base<const_slang::syntax::HierarchicalInstanceSyntax_*> *)
                              in_stack_fffffffffffffe88._M_extent_value), ((bVar1 ^ 0xffU) & 1) != 0
          ) {
      syntax_00 = (HierarchyInstantiationSyntax *)
                  iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax>::iterator_base<const_slang::syntax::HierarchicalInstanceSyntax_*>,_false>
                  ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax>::iterator_base<const_slang::syntax::HierarchicalInstanceSyntax_*>,_false>
                               *)0xfc5b8f);
      sVar6 = parsing::Token::valueText((Token *)in_stack_fffffffffffffea0.m_bits);
      sVar4._M_str = (char *)pPVar8;
      sVar4._M_len = sVar7;
      sVar3._M_extent._M_extent_value = in_stack_ffffffffffffff48._M_extent_value;
      sVar3._M_ptr = ppEVar2;
      in_stack_fffffffffffffe88._M_extent_value = netType_00._M_extent_value;
      in_stack_fffffffffffffe90._M_extent_value = local_90._M_extent_value;
      in_stack_fffffffffffffea0.m_bits = (underlying_type)local_48;
      createUninstantiatedDef<slang::syntax::HierarchyInstantiationSyntax>
                (compilation_00,syntax_00,(HierarchicalInstanceSyntax *)sVar6._M_str,sVar4,
                 (ASTContext *)sVar6._M_len,sVar3,in_stack_ffffffffffffff50,
                 in_stack_ffffffffffffff58._0_8_,in_stack_ffffffffffffff58._8_8_,
                 (NetType *)netType_00._M_extent_value);
      iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax>::iterator_base<const_slang::syntax::HierarchicalInstanceSyntax_*>,_false>
      ::
      operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax>::iterator_base<const_slang::syntax::HierarchicalInstanceSyntax_*>_>
                ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax>::iterator_base<const_slang::syntax::HierarchicalInstanceSyntax_*>,_false>
                  *)in_stack_fffffffffffffe90._M_extent_value);
    }
  }
  else {
    sVar4 = parsing::Token::valueText((Token *)in_stack_fffffffffffffea0.m_bits);
    sVar6._M_str = in_stack_ffffffffffffff30;
    sVar6._M_len = in_stack_ffffffffffffff28;
    params_00._M_extent._M_extent_value = netType_00._M_extent_value;
    params_00._M_ptr = in_stack_ffffffffffffff40;
    createUninstantiatedDef<slang::syntax::HierarchyInstantiationSyntax>
              (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff08._8_8_,
               sVar6,in_stack_ffffffffffffff08._0_8_,params_00,
               (SmallVectorBase<const_slang::ast::Symbol_*> *)local_90._M_extent_value,
               (SmallVectorBase<const_slang::ast::Symbol_*> *)sVar4._M_len,
               (SmallSet<std::basic_string_view<char,_std::char_traits<char>_>,_8UL,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
                *)sVar4._M_str,(NetType *)netType_00._M_extent_value);
  }
  return;
}

Assistant:

void UninstantiatedDefSymbol::fromSyntax(
    Compilation& compilation, const syntax::HierarchyInstantiationSyntax& syntax,
    const syntax::HierarchicalInstanceSyntax* specificInstance, const ASTContext& parentContext,
    SmallVectorBase<const Symbol*>& results, SmallVectorBase<const Symbol*>& implicitNets,
    SmallSet<std::string_view, 8>& implicitNetNames, const NetType& netType) {

    ASTContext context = parentContext.resetFlags(ASTFlags::NonProcedural);
    auto params = createUninstantiatedParams(syntax, context);

    if (specificInstance) {
        createUninstantiatedDef(compilation, syntax, specificInstance, syntax.type.valueText(),
                                context, params, results, implicitNets, implicitNetNames, netType);
    }
    else {
        for (auto instanceSyntax : syntax.instances) {
            createUninstantiatedDef(compilation, syntax, instanceSyntax, syntax.type.valueText(),
                                    context, params, results, implicitNets, implicitNetNames,
                                    netType);
        }
    }
}